

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleObjectLookup.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  string_view attribute;
  string_view attribute_00;
  string_view attribute_01;
  string_view attribute_02;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attrName_03;
  string_view attrName_04;
  string_view attribute_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view attribute_04;
  string_view attribute_05;
  string_view attribute_06;
  bool bVar1;
  byte bVar2;
  uint8_t *start;
  ostream *poVar3;
  void *pvVar4;
  exception *ex;
  Slice foobar;
  Slice qux;
  Slice quetzal;
  Slice bar;
  Slice s;
  Builder b;
  undefined4 in_stack_fffffffffffff938;
  ValueType t;
  undefined2 in_stack_fffffffffffff93c;
  ValueType in_stack_fffffffffffff93e;
  ValueType in_stack_fffffffffffff93f;
  Builder *in_stack_fffffffffffff940;
  undefined6 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94e;
  ValueType in_stack_fffffffffffff94f;
  Builder *in_stack_fffffffffffff950;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffff958;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffff960;
  allocator_type *in_stack_fffffffffffff968;
  Builder *in_stack_fffffffffffff970;
  iterator in_stack_fffffffffffff978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffff9c0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffa28;
  undefined1 ***pppuVar5;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  char *in_stack_fffffffffffffa38;
  undefined8 **local_578;
  undefined8 **local_4e8;
  string local_3f0 [64];
  uint8_t *local_3b0;
  uint8_t *local_3a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_39c;
  undefined1 local_39b;
  allocator<char> local_39a;
  allocator<char> local_399;
  undefined1 **local_398;
  undefined8 *local_390 [4];
  undefined1 local_370 [32];
  undefined1 **local_350;
  undefined8 local_348;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_324;
  undefined1 local_323;
  allocator<char> local_322;
  allocator<char> local_321;
  undefined1 **local_320;
  undefined8 *local_318 [4];
  undefined1 local_2f8 [32];
  undefined1 **local_2d8;
  undefined8 local_2d0;
  uint8_t *local_2b0;
  uint8_t *local_298;
  string local_290 [36];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_26c;
  undefined1 local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  undefined1 **local_268;
  undefined8 *local_260 [4];
  undefined1 local_240 [32];
  undefined1 **local_220;
  undefined8 local_218;
  uint8_t *local_1f8;
  uint8_t *local_1e0;
  uint8_t *local_1c8;
  Slice local_1b0 [3];
  int local_198;
  int local_178;
  Builder local_c8;
  int local_4;
  
  local_4 = 0;
  arangodb::velocypack::Builder::Builder(in_stack_fffffffffffff970);
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff950,in_stack_fffffffffffff94f,
             (bool)in_stack_fffffffffffff94e);
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffff940,
             (Value *)CONCAT17(in_stack_fffffffffffff93f,
                               CONCAT16(in_stack_fffffffffffff93e,
                                        CONCAT24(in_stack_fffffffffffff93c,in_stack_fffffffffffff938
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff940,
             CONCAT13(in_stack_fffffffffffff93f,
                      CONCAT12(in_stack_fffffffffffff93e,in_stack_fffffffffffff93c)),
             (ValueType)((uint)in_stack_fffffffffffff938 >> 0x18));
  attrName._M_str = (char *)in_stack_fffffffffffff960;
  attrName._M_len = (size_t)in_stack_fffffffffffff958;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffff950,attrName,
             (Value *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff940,
             (char *)CONCAT17(in_stack_fffffffffffff93f,
                              CONCAT16(in_stack_fffffffffffff93e,
                                       CONCAT24(in_stack_fffffffffffff93c,in_stack_fffffffffffff938)
                                      )),None);
  attrName_00._M_str = (char *)in_stack_fffffffffffff960;
  attrName_00._M_len = (size_t)in_stack_fffffffffffff958;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffff950,attrName_00,
             (Value *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff950,in_stack_fffffffffffff94f,
             (bool)in_stack_fffffffffffff94e);
  attrName_01._M_str = (char *)in_stack_fffffffffffff960;
  attrName_01._M_len = (size_t)in_stack_fffffffffffff958;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffff950,attrName_01,
             (Value *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff940,(bool)in_stack_fffffffffffff93f,
             in_stack_fffffffffffff93e);
  attrName_02._M_str = (char *)in_stack_fffffffffffff960;
  attrName_02._M_len = (size_t)in_stack_fffffffffffff958;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffff950,attrName_02,
             (Value *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff940,
             (char *)CONCAT17(in_stack_fffffffffffff93f,
                              CONCAT16(in_stack_fffffffffffff93e,
                                       CONCAT24(in_stack_fffffffffffff93c,in_stack_fffffffffffff938)
                                      )),None);
  t = (ValueType)((uint)in_stack_fffffffffffff938 >> 0x18);
  attrName_03._M_str = (char *)in_stack_fffffffffffff960;
  attrName_03._M_len = (size_t)in_stack_fffffffffffff958;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffff950,attrName_03,
             (Value *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Builder::close(&local_c8,local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffff940,
             CONCAT13(in_stack_fffffffffffff93f,
                      CONCAT12(in_stack_fffffffffffff93e,in_stack_fffffffffffff93c)),t);
  attrName_04._M_str = (char *)in_stack_fffffffffffff960;
  attrName_04._M_len = (size_t)in_stack_fffffffffffff958;
  arangodb::velocypack::Builder::add
            (in_stack_fffffffffffff950,attrName_04,
             (Value *)CONCAT17(in_stack_fffffffffffff94f,
                               CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  arangodb::velocypack::Builder::close(&local_c8,local_198);
  start = arangodb::velocypack::Builder::start(in_stack_fffffffffffff940);
  arangodb::velocypack::Slice::Slice(local_1b0,start);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  attribute_03._M_str = (char *)in_stack_fffffffffffff960;
  attribute_03._M_len = (size_t)in_stack_fffffffffffff958;
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::hasKey((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                   in_stack_fffffffffffff950,attribute_03);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
               (char *)CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
    attribute_04._M_len._7_1_ = in_stack_fffffffffffffa37;
    attribute_04._M_len._0_7_ = in_stack_fffffffffffffa30;
    attribute_04._M_str = in_stack_fffffffffffffa38;
    local_1c8 = (uint8_t *)
                arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                          (in_stack_fffffffffffffa28,attribute_04);
    std::operator<<((ostream *)&std::cout,"\'bar\' attribute value has type: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_fffffffffffff940);
    poVar3 = operator<<((ostream *)in_stack_fffffffffffff940,in_stack_fffffffffffff93f);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  attribute_05._M_len._7_1_ = in_stack_fffffffffffffa37;
  attribute_05._M_len._0_7_ = in_stack_fffffffffffffa30;
  attribute_05._M_str = in_stack_fffffffffffffa38;
  local_1e0 = (uint8_t *)
              arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                        (in_stack_fffffffffffffa28,attribute_05);
  std::operator<<((ostream *)&std::cout,"\'quetzal\' attribute value has type: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
             in_stack_fffffffffffff940);
  poVar3 = operator<<((ostream *)in_stack_fffffffffffff940,in_stack_fffffffffffff93f);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'quetzal\' attribute is None: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::isNone((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x103966);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,bVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_26b = 1;
  local_268 = (undefined1 **)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,
             (allocator<char> *)in_stack_fffffffffffff970);
  local_268 = (undefined1 **)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,
             (allocator<char> *)in_stack_fffffffffffff970);
  local_26b = 0;
  local_220 = (undefined1 **)local_260;
  local_218 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x103a6d);
  __l._M_len = (size_type)in_stack_fffffffffffff980;
  __l._M_array = in_stack_fffffffffffff978;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff970,__l,in_stack_fffffffffffff968);
  local_1f8 = (uint8_t *)
              arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
              get<std::__cxx11::string>
                        (in_stack_fffffffffffff958,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff950,(bool)in_stack_fffffffffffff94f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff950);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_26c);
  local_4e8 = &local_220;
  do {
    local_4e8 = local_4e8 + -4;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940);
  } while (local_4e8 != local_260);
  std::allocator<char>::~allocator(&local_26a);
  std::allocator<char>::~allocator(&local_269);
  std::operator<<((ostream *)&std::cout,"\'baz\'.\'qux\' attribute has type: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
             in_stack_fffffffffffff940);
  poVar3 = operator<<((ostream *)in_stack_fffffffffffff940,in_stack_fffffffffffff93f);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'baz\'.\'qux\' attribute has bool value: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::getBoolean((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       0x103bed);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,bVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Complete value of \'baz\' is: ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
             (char *)CONCAT17(in_stack_fffffffffffff94f,
                              CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
  attribute_06._M_len._7_1_ = in_stack_fffffffffffffa37;
  attribute_06._M_len._0_7_ = in_stack_fffffffffffffa30;
  attribute_06._M_str = in_stack_fffffffffffffa38;
  local_298 = (uint8_t *)
              arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::get
                        (in_stack_fffffffffffffa28,attribute_06);
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
  toJson_abi_cxx11_((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                    in_stack_fffffffffffff978,(Options *)in_stack_fffffffffffff970);
  poVar3 = std::operator<<(poVar3,local_290);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff940);
  local_323 = 1;
  local_320 = (undefined1 **)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,
             (allocator<char> *)in_stack_fffffffffffff970);
  local_320 = (undefined1 **)local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,
             (allocator<char> *)in_stack_fffffffffffff970);
  local_323 = 0;
  local_2d8 = (undefined1 **)local_318;
  local_2d0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x103dcf);
  __l_00._M_len = (size_type)in_stack_fffffffffffff980;
  __l_00._M_array = in_stack_fffffffffffff978;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff970,__l_00,in_stack_fffffffffffff968);
  local_2b0 = (uint8_t *)
              arangodb::velocypack::
              SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
              get<std::__cxx11::string>
                        (in_stack_fffffffffffff958,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff950,(bool)in_stack_fffffffffffff94f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff950);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_324);
  local_578 = &local_2d8;
  do {
    local_578 = local_578 + -4;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940);
  } while (local_578 != local_318);
  std::allocator<char>::~allocator(&local_322);
  std::allocator<char>::~allocator(&local_321);
  poVar3 = std::operator<<((ostream *)&std::cout,"\'bark\'.\'foobar\' attribute is None: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::boolalpha);
  bVar1 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::isNone((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x103ef5);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,bVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_39b = 1;
  local_398 = (undefined1 **)local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,
             (allocator<char> *)in_stack_fffffffffffff970);
  local_398 = (undefined1 **)local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978,
             (allocator<char> *)in_stack_fffffffffffff970);
  local_39b = 0;
  local_350 = (undefined1 **)local_390;
  local_348 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x103ffc);
  __l_01._M_len = (size_type)in_stack_fffffffffffff980;
  __l_01._M_array = in_stack_fffffffffffff978;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff970,__l_01,in_stack_fffffffffffff968);
  bVar2 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
          hasKey<std::__cxx11::string>
                    (in_stack_fffffffffffff960,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff958);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff950);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_39c);
  pppuVar5 = &local_350;
  do {
    pppuVar5 = pppuVar5 + -4;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940);
  } while (pppuVar5 != (undefined1 ***)local_390);
  std::allocator<char>::~allocator(&local_39a);
  std::allocator<char>::~allocator(&local_399);
  if ((bVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"\'baz\'.\'bart\' attribute has type: ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
               (char *)CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
    attribute._M_str = (char *)in_stack_fffffffffffff958;
    attribute._M_len = (size_t)in_stack_fffffffffffff950;
    local_3b0 = (uint8_t *)
                arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::operator[]
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           CONCAT17(in_stack_fffffffffffff94f,
                                    CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)),
                           attribute);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
               (char *)CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
    attribute_00._M_str = (char *)in_stack_fffffffffffff958;
    attribute_00._M_len = (size_t)in_stack_fffffffffffff950;
    local_3a8 = (uint8_t *)
                arangodb::velocypack::
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::operator[]
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           CONCAT17(in_stack_fffffffffffff94f,
                                    CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)),
                           attribute_00);
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_fffffffffffff940);
    poVar3 = operator<<((ostream *)in_stack_fffffffffffff940,in_stack_fffffffffffff93f);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"\'baz\'.\'bart\' attribute has value: \'");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
               (char *)CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
    attribute_01._M_str = (char *)in_stack_fffffffffffff958;
    attribute_01._M_len = (size_t)in_stack_fffffffffffff950;
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    operator[]((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               CONCAT17(in_stack_fffffffffffff94f,
                        CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)),attribute_01)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff950,
               (char *)CONCAT17(in_stack_fffffffffffff94f,
                                CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)));
    attribute_02._M_str = (char *)in_stack_fffffffffffff958;
    attribute_02._M_len = (size_t)in_stack_fffffffffffff950;
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    operator[]((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               CONCAT17(in_stack_fffffffffffff94f,
                        CONCAT16(in_stack_fffffffffffff94e,in_stack_fffffffffffff948)),attribute_02)
    ;
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    copyString_abi_cxx11_(in_stack_fffffffffffff9c0);
    poVar3 = std::operator<<(poVar3,local_3f0);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940);
  }
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffff940);
  return local_4;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with a few members
  Builder b;

  b(Value(ValueType::Object));
  b.add("foo", Value(42));
  b.add("bar", Value("some string value"));
  b.add("baz", Value(ValueType::Object));
  b.add("qux", Value(true));
  b.add("bart", Value("this is a string"));
  b.close();
  b.add("quux", Value(12345));
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // now fetch the string in the object's "bar" attribute
  if (s.hasKey("bar")) {
    Slice bar(s.get("bar"));
    std::cout << "'bar' attribute value has type: " << bar.type() << std::endl;
  }

  // fetch non-existing attribute "quetzal"
  Slice quetzal(s.get("quetzal"));
  // note: this returns a slice of type None
  std::cout << "'quetzal' attribute value has type: " << quetzal.type()
            << std::endl;
  std::cout << "'quetzal' attribute is None: " << std::boolalpha
            << quetzal.isNone() << std::endl;

  // fetch subattribute "baz.qux"
  Slice qux(s.get(std::vector<std::string>({"baz", "qux"})));
  std::cout << "'baz'.'qux' attribute has type: " << qux.type() << std::endl;
  std::cout << "'baz'.'qux' attribute has bool value: " << std::boolalpha
            << qux.getBoolean() << std::endl;
  std::cout << "Complete value of 'baz' is: " << s.get("baz").toJson()
            << std::endl;

  // fetch non-existing subattribute "bark.foobar"
  Slice foobar(s.get(std::vector<std::string>({"bark", "foobar"})));
  std::cout << "'bark'.'foobar' attribute is None: " << std::boolalpha
            << foobar.isNone() << std::endl;

  // check if subattribute "baz"."bart" does exist
  if (s.hasKey(std::vector<std::string>({"baz", "bart"}))) {
    // access subattribute using operator syntax
    std::cout << "'baz'.'bart' attribute has type: " << s["baz"]["bart"].type()
              << std::endl;
    std::cout << "'baz'.'bart' attribute has value: '"
              << s["baz"]["bart"].copyString() << "'" << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}